

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  result;
  string u8str;
  u32string u32str;
  u16string u16str;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_258;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_238 [7];
  undefined8 auStack_150 [36];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: benchmark UTF8FILE [ITERATIONS]\n",0x27);
    iVar2 = 1;
  }
  else {
    std::ifstream::ifstream(local_238,argv[1],_S_in);
    result.container =
         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)0x0;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_278,
               *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0]._M_dataplus._M_p + -0xc)),
               0xffffffff,0,0xffffffff);
    std::ifstream::~ifstream(local_238);
    local_238[0]._M_string_length = 0;
    local_238[0].field_2._M_local_buf[0] = L'\0';
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    utf8::
    utf8to16<std::back_insert_iterator<std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((utf8 *)local_278._M_dataplus._M_p,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_278._M_dataplus._M_p + local_278._M_string_length),
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_238,
               (back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )result.container);
    local_258._M_string_length = 0;
    local_258.field_2._M_local_buf[0] = L'\0';
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    utf8::
    utf8to32<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::u32string>>
              ((utf8 *)local_278._M_dataplus._M_p,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_278._M_dataplus._M_p + local_278._M_string_length),
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&local_258,result);
    iVar2 = 1;
    if (argc != 2) {
      iVar2 = atoi(argv[2]);
    }
    paVar1 = &local_298.field_2;
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"codecvt u8 to u16","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::codecvt_u8_to_u16,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"cpputf8 u8 to u16","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::cpputf8_u8_to_u16,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"boost u8 to u16","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::boost_u8_to_u16,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range u8 to u16","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::range_u8_to_u16,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range view u8 to u16","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::range_view_u8_to_u16,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"codecvt u8 to u32","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::codecvt_u8_to_u32,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"cpputf8 u8 to u32","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::cpputf8_u8_to_u32,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"boost u8 to u32","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::boost_u8_to_u32,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range u8 to u32","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::range_u8_to_u32,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range view u8 to u32","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_eb88::range_view_u8_to_u32,&local_278,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"codecvt u16 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::codecvt_u16_to_u8,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"cpputf8 u16 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::cpputf8_u16_to_u8,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"boost u16 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::boost_u16_to_u8,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range u16 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::range_u16_to_u8,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range view u16 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::range_view_u16_to_u8,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"*codecvt u16 to u32","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::codecvt_u16_to_u32,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"*cpputf8 u16 to u32","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::cpputf8_u16_to_u32,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"boost u16 to u32","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::boost_u16_to_u32,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range u16 to u32","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::range_u16_to_u32,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range view u16 to u32","")
    ;
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_eb88::range_view_u16_to_u32,local_238,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"codecvt u32 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::codecvt_u32_to_u8,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"cpputf8 u32 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::cpputf8_u32_to_u8,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"boost u32 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::boost_u32_to_u8,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range u32 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::range_u32_to_u8,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range view u32 to u8","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::range_view_u32_to_u8,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"*codecvt u32 to u16","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::codecvt_u32_to_u16,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"*cpputf8 u32 to u16","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::cpputf8_u32_to_u16,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"boost u32 to u16","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::boost_u32_to_u16,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range u32 to u16","");
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::range_u32_to_u16,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"range view u32 to u16","")
    ;
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_eb88::range_view_u32_to_u16,&local_258,iVar2,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT44(local_258.field_2._M_local_buf[1],local_258.field_2._M_local_buf[0])
                      * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,
                      CONCAT62(local_238[0].field_2._M_allocated_capacity._2_6_,
                               local_238[0].field_2._M_local_buf[0]) * 2 + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 2) {
        std::cout << "Usage: benchmark UTF8FILE [ITERATIONS]\n";
        return 1;
    }

    const string u8str = [argv] {
        std::ifstream f(argv[1]);
        return string(std::istreambuf_iterator<char>{f},
                      std::istreambuf_iterator<char>{});
    }();

    const u16string u16str = cpputf8_u8_to_u16(u8str);
    const u32string u32str = cpputf8_u8_to_u32(u8str);

    const int num_iterations = argc > 2 ? std::atoi(argv[2]) : 1;


    // UTF-8 to UTF-16
    time_function_call(codecvt_u8_to_u16, u8str, num_iterations, "codecvt u8 to u16");
    time_function_call(cpputf8_u8_to_u16, u8str, num_iterations, "cpputf8 u8 to u16");
    time_function_call(boost_u8_to_u16, u8str, num_iterations, "boost u8 to u16");
    time_function_call(range_u8_to_u16, u8str, num_iterations, "range u8 to u16");
    time_function_call(range_view_u8_to_u16, u8str, num_iterations, "range view u8 to u16");
    std::cout << "\n";

    // UTF-8 to UTF-32
    time_function_call(codecvt_u8_to_u32, u8str, num_iterations, "codecvt u8 to u32");
    time_function_call(cpputf8_u8_to_u32, u8str, num_iterations, "cpputf8 u8 to u32");
    time_function_call(boost_u8_to_u32, u8str, num_iterations, "boost u8 to u32");
    time_function_call(range_u8_to_u32, u8str, num_iterations, "range u8 to u32");
    time_function_call(range_view_u8_to_u32, u8str, num_iterations, "range view u8 to u32");
    std::cout << "\n";

    // UTF-16 to UTF-8
    time_function_call(codecvt_u16_to_u8, u16str, num_iterations, "codecvt u16 to u8");
    time_function_call(cpputf8_u16_to_u8, u16str, num_iterations, "cpputf8 u16 to u8");
    time_function_call(boost_u16_to_u8, u16str, num_iterations, "boost u16 to u8");
    time_function_call(range_u16_to_u8, u16str, num_iterations, "range u16 to u8");
    time_function_call(range_view_u16_to_u8, u16str, num_iterations, "range view u16 to u8");
    std::cout << "\n";

    // UTF-16 to UTF-32
    time_function_call(codecvt_u16_to_u32, u16str, num_iterations, "*codecvt u16 to u32");
    time_function_call(cpputf8_u16_to_u32, u16str, num_iterations, "*cpputf8 u16 to u32");
    time_function_call(boost_u16_to_u32, u16str, num_iterations, "boost u16 to u32");
    time_function_call(range_u16_to_u32, u16str, num_iterations, "range u16 to u32");
    time_function_call(range_view_u16_to_u32, u16str, num_iterations, "range view u16 to u32");
    std::cout << "\n";

    // UTF-32 to UTF-8
    time_function_call(codecvt_u32_to_u8, u32str, num_iterations, "codecvt u32 to u8");
    time_function_call(cpputf8_u32_to_u8, u32str, num_iterations, "cpputf8 u32 to u8");
    time_function_call(boost_u32_to_u8, u32str, num_iterations, "boost u32 to u8");
    time_function_call(range_u32_to_u8, u32str, num_iterations, "range u32 to u8");
    time_function_call(range_view_u32_to_u8, u32str, num_iterations, "range view u32 to u8");
    std::cout << "\n";

    // UTF-32 to UTF-16
    time_function_call(codecvt_u32_to_u16, u32str, num_iterations, "*codecvt u32 to u16");
    time_function_call(cpputf8_u32_to_u16, u32str, num_iterations, "*cpputf8 u32 to u16");
    time_function_call(boost_u32_to_u16, u32str, num_iterations, "boost u32 to u16");
    time_function_call(range_u32_to_u16, u32str, num_iterations, "range u32 to u16");
    time_function_call(range_view_u32_to_u16, u32str, num_iterations, "range view u32 to u16");
}